

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.h
# Opt level: O3

void __thiscall
cmTargetCompileFeaturesCommand::~cmTargetCompileFeaturesCommand
          (cmTargetCompileFeaturesCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmTargetPropCommandBase).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmTargetPropCommandBase_00613048;
  pcVar2 = (this->super_cmTargetPropCommandBase).Property._M_dataplus._M_p;
  paVar1 = &(this->super_cmTargetPropCommandBase).Property.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  cmCommand::~cmCommand((cmCommand *)this);
  operator_delete(this,0x78);
  return;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTargetCompileFeaturesCommand;
    }